

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O0

void __thiscall cmDebugger::cmDebuggerVariables::~cmDebuggerVariables(cmDebuggerVariables *this)

{
  element_type *this_00;
  cmDebuggerVariables *this_local;
  
  this->_vptr_cmDebuggerVariables = (_func_int **)&PTR_HandleVariablesRequest_015114a0;
  ClearSubVariables(this);
  this_00 = std::
            __shared_ptr_access<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->VariablesManager);
  cmDebuggerVariablesManager::UnregisterHandler(this_00,this->Id);
  std::shared_ptr<cmDebugger::cmDebuggerVariablesManager>::~shared_ptr(&this->VariablesManager);
  std::
  vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
  ::~vector(&this->SubVariables);
  std::
  function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
  ::~function(&this->GetKeyValuesFunction);
  std::__cxx11::string::~string((string *)&this->Value);
  std::__cxx11::string::~string((string *)&this->Name);
  return;
}

Assistant:

cmDebuggerVariables::~cmDebuggerVariables()
{
  ClearSubVariables();
  VariablesManager->UnregisterHandler(Id);
}